

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  group_type_pointer pgVar1;
  value_type_pointer sv;
  size_t sVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  ushort uVar7;
  char *pcVar8;
  size_t sVar9;
  undefined7 uVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  group_type_pointer pgVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  value_type_pointer ppVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  ppVar18 = (this->arrays).elements_;
  if (ppVar18 != (value_type_pointer)0x0) {
    sVar2 = (this->arrays).groups_size_mask;
    pgVar3 = (this->arrays).groups_;
    if (pgVar3 != pgVar3 + sVar2 + 1) {
      pgVar14 = pgVar3;
      do {
        auVar20[0] = -(pgVar14->m[0].n == '\0');
        auVar20[1] = -(pgVar14->m[1].n == '\0');
        auVar20[2] = -(pgVar14->m[2].n == '\0');
        auVar20[3] = -(pgVar14->m[3].n == '\0');
        auVar20[4] = -(pgVar14->m[4].n == '\0');
        auVar20[5] = -(pgVar14->m[5].n == '\0');
        auVar20[6] = -(pgVar14->m[6].n == '\0');
        auVar20[7] = -(pgVar14->m[7].n == '\0');
        auVar20[8] = -(pgVar14->m[8].n == '\0');
        auVar20[9] = -(pgVar14->m[9].n == '\0');
        auVar20[10] = -(pgVar14->m[10].n == '\0');
        auVar20[0xb] = -(pgVar14->m[0xb].n == '\0');
        auVar20[0xc] = -(pgVar14->m[0xc].n == '\0');
        auVar20[0xd] = -(pgVar14->m[0xd].n == '\0');
        auVar20[0xe] = -(pgVar14->m[0xe].n == '\0');
        auVar20[0xf] = -(pgVar14->m[0xf].n == '\0');
        for (uVar13 = ((uint)(pgVar3 + sVar2 != pgVar14) << 0xe | 0x3fff) &
                      ~(uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(auVar20[0xf] >> 7) << 0xf); uVar13 != 0;
            uVar13 = uVar13 - 1 & uVar13) {
          uVar16 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          sv = ppVar18 + uVar16;
          uVar11 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                   operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this,&sv->first);
          uVar15 = uVar11 >> ((byte)new_arrays_->groups_size_index & 0x3f);
          pgVar4 = new_arrays_->groups_;
          pgVar1 = pgVar4 + uVar15;
          auVar22[0] = -(pgVar1->m[0].n == '\0');
          auVar22[1] = -(pgVar1->m[1].n == '\0');
          auVar22[2] = -(pgVar1->m[2].n == '\0');
          auVar22[3] = -(pgVar1->m[3].n == '\0');
          auVar22[4] = -(pgVar1->m[4].n == '\0');
          auVar22[5] = -(pgVar1->m[5].n == '\0');
          auVar22[6] = -(pgVar1->m[6].n == '\0');
          auVar22[7] = -(pgVar1->m[7].n == '\0');
          auVar22[8] = -(pgVar1->m[8].n == '\0');
          auVar22[9] = -(pgVar1->m[9].n == '\0');
          auVar22[10] = -(pgVar1->m[10].n == '\0');
          auVar22[0xb] = -(pgVar1->m[0xb].n == '\0');
          auVar22[0xc] = -(pgVar1->m[0xc].n == '\0');
          auVar22[0xd] = -(pgVar1->m[0xd].n == '\0');
          auVar22[0xe] = -(pgVar1->m[0xe].n == '\0');
          auVar22[0xf] = -(pgVar1->m[0xf].n == '\0');
          uVar16 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
          if (uVar16 == 0) {
            uVar12 = new_arrays_->groups_size_mask;
            lVar17 = 1;
            do {
              pgVar4[uVar15].m[0xf].n = pgVar4[uVar15].m[0xf].n | '\x01' << ((byte)uVar11 & 7);
              uVar15 = uVar15 + lVar17 & uVar12;
              pgVar1 = pgVar4 + uVar15;
              auVar21[0] = -(pgVar1->m[0].n == '\0');
              auVar21[1] = -(pgVar1->m[1].n == '\0');
              auVar21[2] = -(pgVar1->m[2].n == '\0');
              auVar21[3] = -(pgVar1->m[3].n == '\0');
              auVar21[4] = -(pgVar1->m[4].n == '\0');
              auVar21[5] = -(pgVar1->m[5].n == '\0');
              auVar21[6] = -(pgVar1->m[6].n == '\0');
              auVar21[7] = -(pgVar1->m[7].n == '\0');
              auVar21[8] = -(pgVar1->m[8].n == '\0');
              auVar21[9] = -(pgVar1->m[9].n == '\0');
              auVar21[10] = -(pgVar1->m[10].n == '\0');
              auVar21[0xb] = -(pgVar1->m[0xb].n == '\0');
              auVar21[0xc] = -(pgVar1->m[0xc].n == '\0');
              auVar21[0xd] = -(pgVar1->m[0xd].n == '\0');
              auVar21[0xe] = -(pgVar1->m[0xe].n == '\0');
              auVar21[0xf] = -(pgVar1->m[0xf].n == '\0');
              uVar7 = (ushort)(SUB161(auVar21 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe;
              uVar16 = (uint)uVar7;
              lVar17 = lVar17 + 1;
            } while (uVar7 == 0);
          }
          uVar6 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar12 = (ulong)uVar6;
          ppVar5 = new_arrays_->elements_;
          pcVar8 = (sv->first)._M_str;
          ppVar5[uVar15 * 0xf + uVar12].first._M_len = (sv->first)._M_len;
          ppVar5[uVar15 * 0xf + uVar12].first._M_str = pcVar8;
          sVar9 = (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                  _M_extent._M_extent_value;
          ppVar5[uVar15 * 0xf + uVar12].second.
          super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr =
               (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr;
          ppVar5[uVar15 * 0xf + uVar12].second.
          super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value
               = sVar9;
          uVar10 = *(undefined7 *)&(sv->second).field_0x11;
          ppVar5[uVar15 * 0xf + uVar12].second.isExpanded = (sv->second).isExpanded;
          *(undefined7 *)&ppVar5[uVar15 * 0xf + uVar12].second.field_0x11 = uVar10;
          pgVar4[uVar15].m[uVar12].n =
               *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word + (uVar11 & 0xff));
        }
        ppVar18 = ppVar18 + 0xf;
        bVar19 = pgVar3 + sVar2 != pgVar14;
        pgVar14 = pgVar14 + 1;
      } while (bVar19);
    }
  }
  delete_arrays((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                 *)(this->
                   super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_2U,_false>
                   ).value_.storage,(arrays_type *)(this->arrays).groups_size_mask);
  sVar2 = new_arrays_->groups_size_mask;
  pgVar3 = new_arrays_->groups_;
  ppVar18 = new_arrays_->elements_;
  (this->arrays).groups_size_index = new_arrays_->groups_size_index;
  (this->arrays).groups_size_mask = sVar2;
  (this->arrays).groups_ = pgVar3;
  (this->arrays).elements_ = ppVar18;
  uVar15 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar15 = 0;
  }
  uVar12 = (ulong)((float)uVar15 * 0.875);
  uVar12 = (long)((float)uVar15 * 0.875 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
  if (uVar15 < 0x1e) {
    uVar12 = uVar15;
  }
  (this->size_ctrl).ml = uVar12;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }